

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_conversions1.cpp
# Opt level: O0

void __thiscall Temperature_Detection_Test::TestBody(Temperature_Detection_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_370;
  AssertHelper local_350;
  Message local_348;
  precise_unit local_340;
  precise_unit local_330;
  bool local_319;
  undefined1 local_318 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_2e8;
  Message local_2e0;
  bool local_2d1;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_2a0;
  Message local_298;
  bool local_289;
  undefined1 local_288 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_258;
  Message local_250;
  precise_unit local_248;
  bool local_231;
  undefined1 local_230 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_200;
  Message local_1f8;
  unit local_1ec;
  bool local_1e1;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_1b0;
  Message local_1a8;
  bool local_199;
  undefined1 local_198 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_168;
  Message local_160;
  bool local_151;
  undefined1 local_150 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_120;
  Message local_118;
  bool local_109;
  undefined1 local_108 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_d8;
  Message local_d0;
  bool local_c1;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_90;
  Message local_88;
  bool local_79;
  undefined1 local_78 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_48;
  Message local_40 [3];
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  Temperature_Detection_Test *this_local;
  
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_21 = units::is_temperature((unit *)&units::degF);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_20,&local_21,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_20,
               (AssertionResult *)"is_temperature(degF)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x153,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_79 = units::is_temperature((precise_unit *)units::precise::degF);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_78,&local_79,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_78,
               (AssertionResult *)"is_temperature(precise::degF)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x154,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  local_c1 = units::is_temperature((unit *)&units::degC);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_c0,&local_c1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_c0,
               (AssertionResult *)"is_temperature(degC)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x155,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  local_109 = units::is_temperature((precise_unit *)units::precise::degC);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_108,&local_109,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_108,
               (AssertionResult *)"is_temperature(precise::degC)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x156,pcVar2);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  local_151 = units::is_temperature((unit *)&units::K);
  local_151 = !local_151;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_150,&local_151,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_150,
               (AssertionResult *)"is_temperature(K)","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x157,pcVar2);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  local_199 = units::is_temperature((precise_unit *)units::precise::K);
  local_199 = !local_199;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_198,&local_199,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_198,
               (AssertionResult *)"is_temperature(precise::K)","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x158,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  local_1ec = units::unit::inv((unit *)&units::degF);
  local_1e1 = units::is_temperature(&local_1ec);
  local_1e1 = !local_1e1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1e0,&local_1e1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_1e0,
               (AssertionResult *)"is_temperature(degF.inv())","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x15a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  local_248 = units::precise_unit::inv((precise_unit *)units::precise::degF);
  local_231 = units::is_temperature(&local_248);
  local_231 = !local_231;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_230,&local_231,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar1) {
    testing::Message::Message(&local_250);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_230,
               (AssertionResult *)"is_temperature(precise::degF.inv())","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x15b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_258,&local_250);
    testing::internal::AssertHelper::~AssertHelper(&local_258);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_250);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  local_289 = units::unit::operator==((unit *)&units::degC,(unit *)&units::K);
  local_289 = !local_289;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_288,&local_289,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar1) {
    testing::Message::Message(&local_298);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__9.message_,(internal *)local_288,(AssertionResult *)"degC == K",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x15e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2a0,&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_2a0);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  local_2d1 = units::precise_unit::operator==
                        ((precise_unit *)units::precise::degC,(precise_unit *)units::precise::K);
  local_2d1 = !local_2d1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2d0,&local_2d1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar1) {
    testing::Message::Message(&local_2e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_2d0,
               (AssertionResult *)"precise::degC == precise::K","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x15f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2e8,&local_2e0);
    testing::internal::AssertHelper::~AssertHelper(&local_2e8);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(&local_2e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  local_340 = units::precise_unit::inv((precise_unit *)units::precise::degC);
  local_330 = units::precise_unit::inv(&local_340);
  local_319 = units::precise_unit::operator==(&local_330,(precise_unit *)units::precise::degC);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_318,&local_319,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_318);
  if (!bVar1) {
    testing::Message::Message(&local_348);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_370,(internal *)local_318,
               (AssertionResult *)"precise::degC.inv().inv() == precise::degC","false","true",in_R9)
    ;
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_conversions1.cpp"
               ,0x160,pcVar2);
    testing::internal::AssertHelper::operator=(&local_350,&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_350);
    std::__cxx11::string::~string((string *)&local_370);
    testing::Message::~Message(&local_348);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
  return;
}

Assistant:

TEST(Temperature, Detection)
{
    using namespace units;
    EXPECT_TRUE(is_temperature(degF));
    EXPECT_TRUE(is_temperature(precise::degF));
    EXPECT_TRUE(is_temperature(degC));
    EXPECT_TRUE(is_temperature(precise::degC));
    EXPECT_FALSE(is_temperature(K));
    EXPECT_FALSE(is_temperature(precise::K));

    EXPECT_FALSE(is_temperature(degF.inv()));
    EXPECT_FALSE(is_temperature(precise::degF.inv()));
    // this is correct since 1 C != 1 K in absolute temperature
    // but per deg C is equal to per Kelvin so this is the desired behavior
    EXPECT_FALSE(degC == K);
    EXPECT_FALSE(precise::degC == precise::K);
    EXPECT_TRUE(precise::degC.inv().inv() == precise::degC);
}